

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall
r_code::list<r_exec::Input>::push_front_free_cell(list<r_exec::Input> *this,Input *t)

{
  pointer pcVar1;
  long lVar2;
  uint64_t uVar3;
  undefined7 uVar4;
  
  pcVar1 = (this->cells).
           super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = this->free_cells;
  this->free_cells = pcVar1[lVar2].next;
  this->free_cell_count = this->free_cell_count - 1;
  core::P<r_exec::BindingMap>::operator=(&pcVar1[lVar2].data.bindings,&t->bindings);
  core::P<r_exec::_Fact>::operator=(&pcVar1[lVar2].data.abstraction,&t->abstraction);
  core::P<r_exec::_Fact>::operator=(&pcVar1[lVar2].data.input,&t->input);
  uVar4 = *(undefined7 *)&t->field_0x19;
  uVar3 = t->ijt;
  pcVar1[lVar2].data.eligible_cause = t->eligible_cause;
  *(undefined7 *)&pcVar1[lVar2].data.field_0x19 = uVar4;
  pcVar1[lVar2].data.ijt = uVar3;
  pcVar1 = (this->cells).
           super__Vector_base<r_code::list<r_exec::Input>::cell,_std::allocator<r_code::list<r_exec::Input>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar1[lVar2].next = this->used_cells_head;
  pcVar1[lVar2].prev = -1;
  this->used_cells_head = lVar2;
  return;
}

Assistant:

void push_front_free_cell(const T &t)
    {
        int64_t free = free_cells;
        free_cells = cells[free_cells].next;
        --free_cell_count;
        cells[free].data = t;
        cells[free].next = used_cells_head;
        cells[free].prev = null;
        used_cells_head = free;
    }